

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

QString * __thiscall
QSQLiteDriver::escapeIdentifier(QSQLiteDriver *this,QString *identifier,IdentifierType type)

{
  QStringView identifier_00;
  QStringView identifier_01;
  bool bVar1;
  QSQLiteDriverPrivate *pQVar2;
  ulong uVar3;
  qsizetype qVar4;
  undefined4 in_ECX;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>
  *in_RDX;
  storage_type *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  qsizetype indexOfSeparator;
  QSQLiteDriverPrivate *d;
  QStringView rightEnclose;
  QStringView leftEnclose;
  QStringView rightName;
  QStringView leftName;
  undefined4 in_stack_fffffffffffffdf8;
  CaseSensitivity in_stack_fffffffffffffdfc;
  QString *in_stack_fffffffffffffe00;
  QStringView *this_00;
  QChar ch;
  QChar local_d2 [101];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QSQLiteDriver *)0x11930b);
  ch.ucs = (char16_t)((ulong)pQVar2 >> 0x30);
  bVar1 = QString::isEmpty((QString *)0x11931a);
  if ((bVar1) ||
     (uVar3 = (**(code **)(*(long *)in_RSI + 0xf0))(in_RSI,in_RDX,in_ECX), (uVar3 & 1) != 0)) {
    QString::QString(in_stack_fffffffffffffe00,
                     (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  else {
    QChar::QChar<char16_t,_true>(local_d2,L'.');
    qVar4 = QString::indexOf((QString *)in_RDI,ch,(qsizetype)in_RDX,in_stack_fffffffffffffdfc);
    if (-1 < qVar4) {
      QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
      QStringView::first((QStringView *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x1193d9);
      QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
      QStringView::sliced(this_00,(qsizetype)in_RDI);
      identifier_00.m_data = in_RSI;
      identifier_00.m_size = (qsizetype)this_00;
      QSQLiteDriverPrivate::isIdentifierEscaped
                ((QSQLiteDriverPrivate *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),identifier_00);
      QStringView::QStringView<const_char16_t_*,_true>(this_00,(char16_t **)in_RDI);
      identifier_01.m_data = in_RSI;
      identifier_01.m_size = (qsizetype)this_00;
      QSQLiteDriverPrivate::isIdentifierEscaped
                ((QSQLiteDriverPrivate *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),identifier_01);
      QStringView::QStringView<const_char16_t_*,_true>(this_00,(char16_t **)in_RDI);
      bVar1 = QStringView::isEmpty((QStringView *)0x119564);
      if ((bVar1) || (bVar1 = QStringView::isEmpty((QStringView *)0x119575), bVar1)) {
        ::operator+((QStringView *)in_RDX,
                    (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        ::operator+((QStringBuilder<const_QStringView_&,_QStringView_&> *)in_RDX,
                    (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        ::operator+((QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>
                     *)in_RDX,
                    (char16_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>
                     *)in_RDX,
                    (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        ::operator+(&in_RDX->a,
                    (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        ::operator+(in_RDX,(QStringView *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
                    *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        goto LAB_00119698;
      }
    }
    ::operator+((char16_t *)in_RDX,
                (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    ::operator+((QStringBuilder<char16_t,_const_QString_&> *)in_RDX,
                (char16_t *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
LAB_00119698:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QSQLiteDriver::escapeIdentifier(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    if (identifier.isEmpty() || isIdentifierEscaped(identifier, type))
        return identifier;

    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const QStringView leftEnclose = d->isIdentifierEscaped(leftName) ? u"" : u"\"";
        const QStringView rightEnclose = d->isIdentifierEscaped(rightName) ? u"" : u"\"";
        if (leftEnclose.isEmpty() || rightEnclose.isEmpty())
            return (leftEnclose + leftName + leftEnclose + u'.' + rightEnclose + rightName
                    + rightEnclose);
    }
    return u'"' + identifier + u'"';
}